

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Number.h
# Opt level: O0

void __thiscall Num::~Num(Num *this)

{
  Num *this_local;
  
  ~Num(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~Num(){}